

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_rtext.c
# Opt level: O0

int rtext_findatomfor(_rtext *x,int xpos,int ypos)

{
  bool bVar1;
  int local_2c;
  int gotone;
  int i;
  int natom;
  int indx;
  int h;
  int w;
  int ypos_local;
  int xpos_local;
  _rtext *x_local;
  
  gotone = 0;
  bVar1 = false;
  natom = ypos;
  indx = xpos;
  h = ypos;
  w = xpos;
  _ypos_local = x;
  rtext_senditup(x,2,&indx,&natom,&i);
  for (local_2c = 0; local_2c <= i; local_2c = local_2c + 1) {
    if ((_ypos_local->x_buf[local_2c] == ';') || (_ypos_local->x_buf[local_2c] == ',')) {
      gotone = gotone + 1;
      bVar1 = false;
    }
    else if ((_ypos_local->x_buf[local_2c] == ' ') || (_ypos_local->x_buf[local_2c] == '\n')) {
      bVar1 = false;
    }
    else {
      if (!bVar1) {
        gotone = gotone + 1;
      }
      bVar1 = true;
    }
  }
  return gotone + -1;
}

Assistant:

int rtext_findatomfor(t_rtext *x, int xpos, int ypos)
{
    int w = xpos, h = ypos, indx, natom = 0, i, gotone = 0;
        /* get byte index of character clicked on */
    rtext_senditup(x, SEND_UPDATE, &w, &h, &indx);
        /* search through for whitespace before that index */
    for (i = 0; i <= indx; i++)
    {
        if (x->x_buf[i] == ';' || x->x_buf[i] == ',')
            natom++, gotone = 0;
        else if (x->x_buf[i] == ' ' || x->x_buf[i] == '\n')
            gotone = 0;
        else
        {
            if (!gotone)
                natom++;
            gotone = 1;
        }
    }
    return (natom-1);
}